

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O0

string * PermsToSymbolicString_abi_cxx11_(perms p)

{
  string *in_RDI;
  long in_FS_OFFSET;
  string *perm_str;
  anon_class_16_2_e41580a9 set_perm;
  string *__a;
  anon_class_16_2_e41580a9 *this;
  size_type in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (anon_class_16_2_e41580a9 *)&stack0xfffffffffffffff3;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(char)((ulong)this >> 0x38),
             (allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  PermsToSymbolicString::anon_class_16_2_e41580a9::operator()
            (this,(size_t)__a,(perms)((ulong)in_RDI >> 0x20),(char)((ulong)in_RDI >> 0x18));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string PermsToSymbolicString(fs::perms p)
{
    std::string perm_str(9, '-');

    auto set_perm = [&](size_t pos, fs::perms required_perm, char letter) {
        if ((p & required_perm) != fs::perms::none) {
            perm_str[pos] = letter;
        }
    };

    set_perm(0, fs::perms::owner_read,   'r');
    set_perm(1, fs::perms::owner_write,  'w');
    set_perm(2, fs::perms::owner_exec,   'x');
    set_perm(3, fs::perms::group_read,   'r');
    set_perm(4, fs::perms::group_write,  'w');
    set_perm(5, fs::perms::group_exec,   'x');
    set_perm(6, fs::perms::others_read,  'r');
    set_perm(7, fs::perms::others_write, 'w');
    set_perm(8, fs::perms::others_exec,  'x');

    return perm_str;
}